

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  ulong uVar2;
  uint64_t n;
  uint64_t t;
  ulong local_38;
  
  std::istream::_M_extract<unsigned_long>(&std::cin);
  if (local_38 != 0) {
    uVar2 = 0;
    do {
      std::istream::_M_extract<unsigned_long>(&std::cin);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      uVar2 = uVar2 + 1;
    } while (uVar2 < local_38);
  }
  return 0;
}

Assistant:

int main() {
  uint64_t t, n;
  std::cin >> t;
  for (uint64_t i = 0; i < t; ++i) {
    std::cin >> n;
    std::cout << solve(n) << std::endl;
  }
  return 0;
}